

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_19::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  bool bVar1;
  int iVar2;
  LogMessage *this;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  LogMessage *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff20;
  second_type *value;
  first_type *in_stack_ffffffffffffff48;
  unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
  *in_stack_ffffffffffffff50;
  string local_98 [52];
  int in_stack_ffffffffffffff9c;
  LogMessage *in_stack_ffffffffffffffa0;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (((anonymous_namespace)::
       Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
       ::local_static_registry == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                                   ::local_static_registry), iVar2 != 0)) {
    in_stack_ffffffffffffff50 =
         (unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
          *)operator_new(0x38);
    std::
    unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
    ::unordered_map((unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
                     *)0x4692b8);
    Register::local_static_registry =
         OnShutdownDelete<std::unordered_map<std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,std::equal_to<std::pair<google::protobuf::MessageLite_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::MessageLite_const*,int>const,google::protobuf::internal::ExtensionInfo>>>>
                   ((unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
                     *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff48 = (first_type *)Register::local_static_registry;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                         ::local_static_registry);
  }
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  value = (second_type *)Register::local_static_registry;
  std::make_pair<google::protobuf::MessageLite_const*&,int&>
            ((MessageLite **)in_stack_ffffffffffffff10,
             (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,std::equal_to<std::pair<google::protobuf::MessageLite_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::MessageLite_const*,int>const,google::protobuf::internal::ExtensionInfo>>>>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,value);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff20,level,(char *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    LogMessage::operator<<
              (in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    (**(code **)(*in_RDI + 0x10))(local_98);
    LogMessage::operator<<
              (in_stack_ffffffffffffff10,
               (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    LogMessage::operator<<
              (in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    LogMessage::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    this = LogMessage::operator<<
                     (in_stack_ffffffffffffff10,
                      (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::__cxx11::string::~string(local_98);
    LogMessage::~LogMessage((LogMessage *)0x46943a);
  }
  return;
}

Assistant:

void Register(const MessageLite* containing_type, int number,
              ExtensionInfo info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry,
                               std::make_pair(containing_type, number), info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName() << "\", field number "
               << number << ".";
  }
}